

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::clean
          (GeometryShaderMaxCombinedTextureUnitsTest *this)

{
  pointer p_Var1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar3;
  
  iVar2 = (*((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (0 < this->m_n_texture_units) {
    iVar2 = 0;
    do {
      (**(code **)(lVar3 + 8))(iVar2 + 0x84c0);
      (**(code **)(lVar3 + 0xb8))(0xde1,0);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_n_texture_units);
    if (0 < this->m_n_texture_units) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        (**(code **)(lVar3 + 0x480))
                  (1,(long)&((this->m_textures).
                             super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
                             ._M_impl.super__Vector_impl_data._M_start)->texture_id + lVar5);
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 8;
      } while (lVar4 < this->m_n_texture_units);
    }
  }
  p_Var1 = (this->m_textures).
           super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_textures).
      super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var1) {
    (this->m_textures).
    super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var1;
  }
  return;
}

Assistant:

void GeometryShaderMaxCombinedTextureUnitsTest::clean()
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind 0 to all texture units */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, 0);
	}

	/* Delete textures */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		gl.deleteTextures(1, &m_textures[i].texture_id);
	}

	m_textures.clear();
}